

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

void __thiscall QResourcePrivate::ensureInitialized(QResourcePrivate *this)

{
  QString *lhs;
  QString *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  QStringView *pQVar3;
  bool bVar4;
  char16_t cVar5;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_const_QString_&> local_78;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  QStringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->related).d.size != 0) ||
     ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1)) goto LAB_00236d27;
  lhs = &this->fileName;
  local_48.d = (Data *)0x1;
  local_48.ptr = L":";
  bVar4 = ::operator==(lhs,(QLatin1StringView *)&local_48);
  if (bVar4) {
    QString::append(lhs,(QChar)0x2f);
  }
  this_00 = &this->absoluteFilePath;
  QString::operator=(this_00,lhs);
  bVar4 = QString::startsWith(this_00,(QChar)0x3a,CaseSensitive);
  if (!bVar4) {
    QString::prepend(this_00,(QChar)0x3a);
  }
  local_30.m_data = (this->fileName).d.ptr;
  local_30.m_size = (this->fileName).d.size;
  if (local_30.m_size == 0) {
LAB_00236c97:
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)CONCAT62(local_68.d._2_6_,0x2f);
    local_68.ptr = (char16_t *)&local_30;
    QStringBuilder<char16_t,_QStringView_&>::convertTo<QString>
              ((QString *)&local_48,(QStringBuilder<char16_t,_QStringView_&> *)&local_68);
    bVar4 = load(this,(QString *)&local_48);
    if (bVar4) {
      local_78.a = L':';
      local_78.b = (QString *)&local_48;
      QStringBuilder<char16_t,_const_QString_&>::convertTo<QString>((QString *)&local_68,&local_78);
      pDVar2 = (this->absoluteFilePath).d.d;
      pQVar3 = (QStringView *)(this->absoluteFilePath).d.ptr;
      (this->absoluteFilePath).d.d = local_68.d;
      (this->absoluteFilePath).d.ptr = local_68.ptr;
      qVar1 = (this->absoluteFilePath).d.size;
      (this->absoluteFilePath).d.size = local_68.size;
      local_68.d = pDVar2;
      local_68.ptr = (char16_t *)pQVar3;
      local_68.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
  }
  else {
    cVar5 = *local_30.m_data;
    if (cVar5 == L':') {
      local_30 = QStringView::mid(&local_30,1,-1);
      if (local_30.m_size == 0) goto LAB_00236c97;
      cVar5 = *local_30.m_data;
    }
    if (cVar5 != L'/') goto LAB_00236c97;
    QStringView::toString((QString *)&local_48,&local_30);
    load(this,(QString *)&local_48);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_00236d27:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QResourcePrivate::ensureInitialized() const
{
    if (!related.isEmpty())
        return;
    if (resourceGlobalData.isDestroyed())
        return;
    QResourcePrivate *that = const_cast<QResourcePrivate *>(this);
    if (fileName == ":"_L1)
        that->fileName += u'/';
    that->absoluteFilePath = fileName;
    if (!that->absoluteFilePath.startsWith(u':'))
        that->absoluteFilePath.prepend(u':');

    QStringView path(fileName);
    if (path.startsWith(u':'))
        path = path.mid(1);

    if (path.startsWith(u'/')) {
        that->load(path.toString());
    } else {
        // Should we search QDir::searchPath() before falling back to root ?
        const QString searchPath(u'/' + path);
        if (that->load(searchPath))
            that->absoluteFilePath = u':' + searchPath;
    }
}